

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CColorConverter.cpp
# Opt level: O2

void irr::video::CColorConverter::convert_A8R8G8B8toB8G8R8(void *sP,s32 sN,void *dP)

{
  ulong uVar1;
  ulong uVar2;
  u8 *sB;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)sN;
  if (sN < 1) {
    uVar2 = uVar1;
  }
  for (; (int)uVar2 != (int)uVar1; uVar1 = uVar1 + 1) {
    *(undefined1 *)dP = *(undefined1 *)((long)sP + uVar1 * 4);
    *(undefined1 *)((long)dP + 1) = *(undefined1 *)((long)sP + uVar1 * 4 + 1);
    *(undefined1 *)((long)dP + 2) = *(undefined1 *)((long)sP + uVar1 * 4 + 2);
    dP = (void *)((long)dP + 3);
  }
  return;
}

Assistant:

void CColorConverter::convert_A8R8G8B8toB8G8R8(const void *sP, s32 sN, void *dP)
{
	u8 *sB = (u8 *)sP;
	u8 *dB = (u8 *)dP;

	for (s32 x = 0; x < sN; ++x) {
		// sB[3] is alpha
		dB[0] = sB[0];
		dB[1] = sB[1];
		dB[2] = sB[2];

		sB += 4;
		dB += 3;
	}
}